

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCDouble.h
# Opt level: O3

double sqrt(double __x)

{
  double dVar1;
  double *in_RDI;
  double dVar2;
  HighsCDouble res;
  HighsCDouble local_18;
  
  dVar2 = *in_RDI + in_RDI[1];
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar1 = 0.0;
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    local_18.hi = *in_RDI;
    local_18.lo = in_RDI[1];
    HighsCDouble::operator/=(&local_18,dVar2);
    dVar1 = (dVar2 + local_18.hi) * 0.5;
  }
  return dVar1;
}

Assistant:

HighsCDouble sqrt(const HighsCDouble& v) {
    double c = std::sqrt(v.hi + v.lo);

    // guard against division by zero
    if (c == 0.0) return 0.0;

    // calculate precise square root by newton step
    HighsCDouble res = v / c;
    res += c;
    // multiplication by 0.5 is exact
    res.hi *= 0.5;
    res.lo *= 0.5;
    return res;
  }